

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws_audio.c
# Opt level: O2

void ws_audio_reset(void *info)

{
  long lVar1;
  byte *pbVar2;
  wsa_state *chip;
  uint MuteMask;
  
  pbVar2 = (byte *)((long)info + 0x15);
  MuteMask = 0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    MuteMask = MuteMask | (uint)*pbVar2 << ((byte)lVar1 & 0x1f);
    pbVar2 = pbVar2 + 0x10;
  }
  *(undefined8 *)((long)info + 8) = 0;
  *(undefined8 *)((long)info + 0x10) = 0;
  ws_set_mute_mask(info,MuteMask);
  *(undefined2 *)((long)info + 0x58) = 0;
  *(undefined1 *)((long)info + 0x5a) = 0;
  *(undefined1 *)((long)info + 0x60) = 0;
  *(undefined8 *)((long)info + 100) = 0x200000001;
  *(undefined8 *)((long)info + 0x50) = 0;
  for (lVar1 = 0x80; lVar1 != 0xc9; lVar1 = lVar1 + 1) {
    ws_audio_port_write(info,(UINT8)lVar1,""[lVar1]);
  }
  return;
}

Assistant:

static void ws_audio_reset(void* info)
{
	wsa_state* chip = (wsa_state*)info;
	UINT32 muteMask;
	int i;
	
	muteMask = ws_get_mute_mask(chip);
	memset(&chip->ws_audio, 0, sizeof(WS_AUDIO));
	ws_set_mute_mask(chip, muteMask);
	
	chip->SweepTime = 0;
	chip->SweepStep = 0;
	chip->NoiseType = 0;
	chip->NoiseRng = 1;
	chip->MainVolume = 0x02;	// 0x04
	chip->PCMVolumeLeft = 0;
	chip->PCMVolumeRight = 0;
	
	RC_RESET(&chip->HBlankTmr);
	
	for (i=0x80;i<0xc9;i++)
		ws_audio_port_write(chip, i, initialIoValue[i]);
}